

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_AllThreeTest_Test::
~ComparisonTest_AllThreeTest_Test(ComparisonTest_AllThreeTest_Test *this)

{
  ComparisonTest_AllThreeTest_Test *this_local;
  
  ~ComparisonTest_AllThreeTest_Test(this);
  operator_delete(this,0x1118);
  return;
}

Assistant:

TEST_F(ComparisonTest, AllThreeTest) {
  proto1_.clear_optional_int32();
  proto2_.clear_optional_float();
  proto2_.set_optional_string("hello world!");

  EXPECT_EQ(
      "added: optional_int32: 101\n"
      "deleted: optional_float: 111\n"
      "modified: optional_string: \"115\" -> \"hello world!\"\n",
      Run());
}